

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  cmMakefile *pcVar1;
  cmLocalGenerator *lg;
  bool bVar2;
  pointer ppcVar3;
  cmGeneratorTarget *this_00;
  mapped_type *ppcVar4;
  pointer ppcVar5;
  ulong uVar6;
  ulong uVar7;
  cmGlobalGenerator *this_01;
  pointer __k;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_48 = (_Base_ptr)(local_60 + 8);
  local_60._8_4_ = _S_red;
  uVar6 = 0;
  local_50._M_p = (pointer)0x0;
  local_40._8_8_ = 0;
  ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_01 = this;
  local_40._M_allocated_capacity = (size_type)local_48;
  if ((this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar3) {
    do {
      pcVar1 = ppcVar3[uVar6];
      for (__k = (pcVar1->ImportedTargetsOwned).
                 super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          __k != (pcVar1->ImportedTargetsOwned).
                 super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                 super__Vector_impl_data._M_finish; __k = __k + 1) {
        lg = (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
        this_00 = (cmGeneratorTarget *)operator_new(0x570);
        cmGeneratorTarget::cmGeneratorTarget(this_00,*__k,lg);
        cmLocalGenerator::AddOwnedImportedGeneratorTarget(lg,this_00);
        this_01 = (cmGlobalGenerator *)local_60;
        ppcVar4 = std::
                  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                  ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                                *)this_01,__k);
        *ppcVar4 = this_00;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->Makefiles).
                                   super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3));
  }
  ppcVar5 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      CreateGeneratorTargets
                (this_01,targetTypes,
                 (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6],ppcVar5[uVar6],
                 (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                  *)local_60);
      ppcVar5 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar7 < (ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >> 3)
      ;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  std::
  _Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree((_Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
               *)local_60);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    for (std::vector<cmTarget*>::const_iterator j =
           mf->GetOwnedImportedTargets().begin();
         j != mf->GetOwnedImportedTargets().end(); ++j) {
      cmLocalGenerator* lg = this->LocalGenerators[i];
      cmGeneratorTarget* gt = new cmGeneratorTarget(*j, lg);
      lg->AddOwnedImportedGeneratorTarget(gt);
      importedMap[*j] = gt;
    }
  }

  // Construct per-target generator information.
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i],
                                 this->LocalGenerators[i], importedMap);
  }
}